

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.hpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerMSL::get_is_rasterization_disabled(CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  bool bVar2;
  
  if (this->is_rasterization_disabled == true) {
    pSVar1 = Compiler::get_entry_point((Compiler *)this);
    bVar2 = true;
    if (pSVar1->model != ExecutionModelVertex) {
      pSVar1 = Compiler::get_entry_point((Compiler *)this);
      if (pSVar1->model != ExecutionModelTessellationControl) {
        pSVar1 = Compiler::get_entry_point((Compiler *)this);
        bVar2 = pSVar1->model == ExecutionModelTessellationEvaluation;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool get_is_rasterization_disabled() const
	{
		return is_rasterization_disabled && (get_entry_point().model == spv::ExecutionModelVertex ||
		                                     get_entry_point().model == spv::ExecutionModelTessellationControl ||
		                                     get_entry_point().model == spv::ExecutionModelTessellationEvaluation);
	}